

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

Operator __thiscall
calculator::ExpressionParser<__int128>::parseOp(ExpressionParser<__int128> *this)

{
  Operator OVar1;
  char cVar2;
  ExpressionParser<__int128> *this_00;
  string *in_RDI;
  ExpressionParser<__int128> *in_stack_ffffffffffffff58;
  ExpressionParser<__int128> *in_stack_ffffffffffffff60;
  allocator<char> local_71;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_39;
  string local_38 [44];
  Operator local_c;
  
  eatSpaces(in_stack_ffffffffffffff60);
  cVar2 = getCharacter(in_stack_ffffffffffffff58);
  this_00 = (ExpressionParser<__int128> *)(ulong)((int)cVar2 - 0x25);
  switch(this_00) {
  case (ExpressionParser<__int128> *)0x0:
    *(long *)(in_RDI + 1) = *(long *)(in_RDI + 1) + 1;
    Operator::Operator(&local_c,10,0x14,0x4c);
    break;
  case (ExpressionParser<__int128> *)0x1:
    *(long *)(in_RDI + 1) = *(long *)(in_RDI + 1) + 1;
    Operator::Operator(&local_c,3,6,0x4c);
    break;
  default:
    Operator::Operator(&local_c,0,0,0x4c);
    break;
  case (ExpressionParser<__int128> *)0x5:
    *(long *)(in_RDI + 1) = *(long *)(in_RDI + 1) + 1;
    cVar2 = getCharacter(in_stack_ffffffffffffff58);
    if (cVar2 == '*') {
      *(long *)(in_RDI + 1) = *(long *)(in_RDI + 1) + 1;
      Operator::Operator(&local_c,0xb,0x1e,0x52);
    }
    else {
      Operator::Operator(&local_c,8,0x14,0x4c);
    }
    break;
  case (ExpressionParser<__int128> *)0x6:
    *(long *)(in_RDI + 1) = *(long *)(in_RDI + 1) + 1;
    Operator::Operator(&local_c,6,10,0x4c);
    break;
  case (ExpressionParser<__int128> *)0x8:
    *(long *)(in_RDI + 1) = *(long *)(in_RDI + 1) + 1;
    Operator::Operator(&local_c,7,10,0x4c);
    break;
  case (ExpressionParser<__int128> *)0xa:
    *(long *)(in_RDI + 1) = *(long *)(in_RDI + 1) + 1;
    Operator::Operator(&local_c,9,0x14,0x4c);
    break;
  case (ExpressionParser<__int128> *)0x17:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    expect(this_00,in_RDI);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    Operator::Operator(&local_c,4,9,0x4c);
    break;
  case (ExpressionParser<__int128> *)0x19:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    expect(this_00,in_RDI);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    std::allocator<char>::~allocator(&local_71);
    Operator::Operator(&local_c,5,9,0x4c);
    break;
  case (ExpressionParser<__int128> *)0x20:
    *(long *)(in_RDI + 1) = *(long *)(in_RDI + 1) + 1;
    Operator::Operator(&local_c,0xc,0x28,0x52);
    break;
  case (ExpressionParser<__int128> *)0x39:
    *(long *)(in_RDI + 1) = *(long *)(in_RDI + 1) + 1;
    Operator::Operator(&local_c,0xb,0x1e,0x52);
    break;
  case (ExpressionParser<__int128> *)0x40:
    *(long *)(in_RDI + 1) = *(long *)(in_RDI + 1) + 1;
    Operator::Operator(&local_c,0xc,0x28,0x52);
    break;
  case (ExpressionParser<__int128> *)0x57:
    *(long *)(in_RDI + 1) = *(long *)(in_RDI + 1) + 1;
    Operator::Operator(&local_c,1,4,0x4c);
  }
  OVar1.associativity = local_c.associativity;
  OVar1.op = local_c.op;
  OVar1.precedence = local_c.precedence;
  return OVar1;
}

Assistant:

Operator parseOp()
  {
    eatSpaces();
    switch (getCharacter())
    {
      case '|': index_++;     return Operator(OPERATOR_BITWISE_OR,      4, 'L');
      case '&': index_++;     return Operator(OPERATOR_BITWISE_AND,     6, 'L');
      case '<': expect("<<"); return Operator(OPERATOR_BITWISE_SHL,     9, 'L');
      case '>': expect(">>"); return Operator(OPERATOR_BITWISE_SHR,     9, 'L');
      case '+': index_++;     return Operator(OPERATOR_ADDITION,       10, 'L');
      case '-': index_++;     return Operator(OPERATOR_SUBTRACTION,    10, 'L');
      case '/': index_++;     return Operator(OPERATOR_DIVISION,       20, 'L');
      case '%': index_++;     return Operator(OPERATOR_MODULO,         20, 'L');
      case '*': index_++; if (getCharacter() != '*')
                              return Operator(OPERATOR_MULTIPLICATION, 20, 'L');
                index_++;     return Operator(OPERATOR_POWER,          30, 'R');
      case '^': index_++;     return Operator(OPERATOR_POWER,          30, 'R');
      case 'e': index_++;     return Operator(OPERATOR_EXPONENT,       40, 'R');
      case 'E': index_++;     return Operator(OPERATOR_EXPONENT,       40, 'R');
      default :               return Operator(OPERATOR_NULL,            0, 'L');
    }
  }